

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

bool __thiscall Catch::WildcardPattern::matches(WildcardPattern *this,string *str)

{
  bool bVar1;
  string local_60;
  ReusableStringStream local_40;
  SourceLineInfo local_28;
  
  switch(this->m_wildcard) {
  case NoWildcard:
    normaliseString(&local_60,this,str);
    bVar1 = std::operator==(&this->m_pattern,&local_60);
    break;
  case WildcardAtStart:
    normaliseString(&local_60,this,str);
    bVar1 = endsWith(&local_60,&this->m_pattern);
    break;
  case WildcardAtEnd:
    normaliseString(&local_60,this,str);
    bVar1 = startsWith(&local_60,&this->m_pattern);
    break;
  case WildcardAtBothEnds:
    normaliseString(&local_60,this,str);
    bVar1 = contains(&local_60,&this->m_pattern);
    break;
  default:
    ReusableStringStream::ReusableStringStream(&local_40);
    local_28.file =
         "/workspace/llm4binary/github/license_c_cmakelists/vladimirgamalyan[P]fontbm/src/external/catch.hpp"
    ;
    local_28.line = 0x3c3b;
    Catch::operator<<(local_40.m_oss,&local_28);
    std::operator<<(local_40.m_oss,": Internal Catch2 error: ");
    std::operator<<(local_40.m_oss,"Unknown enum");
    std::__cxx11::stringbuf::str();
    throw_logic_error(&local_60);
  }
  std::__cxx11::string::~string((string *)&local_60);
  return bVar1;
}

Assistant:

bool WildcardPattern::matches( std::string const& str ) const {
        switch( m_wildcard ) {
            case NoWildcard:
                return m_pattern == normaliseString( str );
            case WildcardAtStart:
                return endsWith( normaliseString( str ), m_pattern );
            case WildcardAtEnd:
                return startsWith( normaliseString( str ), m_pattern );
            case WildcardAtBothEnds:
                return contains( normaliseString( str ), m_pattern );
            default:
                CATCH_INTERNAL_ERROR( "Unknown enum" );
        }
    }